

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall Assimp::ASE::Parser::ParseLV3MappingChannel(Parser *this,uint iChannel,Mesh *mesh)

{
  bool bVar1;
  byte *pbVar2;
  byte bVar3;
  int local_48;
  uint iNumTFaces;
  uint iNumTVertices;
  Mesh *local_38;
  
  iNumTVertices = 0;
  iNumTFaces = 0;
  local_48 = 0;
  local_38 = mesh;
LAB_003e2645:
  do {
    pbVar2 = (byte *)this->filePtr;
    bVar3 = *pbVar2;
    if (bVar3 == 0x2a) {
      this->filePtr = (char *)(pbVar2 + 1);
      bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_NUMTVERTEX",0xf);
      if (bVar1) {
        ParseLV4MeshLong(this,&iNumTVertices);
        goto LAB_003e2645;
      }
      bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_NUMTVFACES",0xf);
      if (bVar1) {
        ParseLV4MeshLong(this,&iNumTFaces);
        goto LAB_003e2645;
      }
      bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_TVERTLIST",0xe);
      if (bVar1) {
        ParseLV3MeshTListBlock(this,iNumTVertices,local_38,iChannel);
        goto LAB_003e2645;
      }
      bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_TFACELIST",0xe);
      if (bVar1) {
        ParseLV3MeshTFaceListBlock(this,iNumTFaces,local_38,iChannel);
        goto LAB_003e2645;
      }
      pbVar2 = (byte *)this->filePtr;
      bVar3 = *pbVar2;
    }
    if ((bVar3 - 0xc < 2) || (bVar3 == 10)) {
      if (this->bLastWasEndLine != false) goto LAB_003e275f;
      this->iLineNumber = this->iLineNumber + 1;
      bVar1 = true;
    }
    else {
      if (bVar3 == 0x7b) {
        local_48 = local_48 + 1;
      }
      else if (bVar3 == 0x7d) {
        local_48 = local_48 + -1;
        if (local_48 == 0) {
          this->filePtr = (char *)(pbVar2 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      else if (bVar3 == 0) {
        LogError(this,
                 "Encountered unexpected EOL while parsing a *MESH_MAPPING_CHANNEL chunk (Level 3)")
        ;
      }
LAB_003e275f:
      bVar1 = false;
    }
    this->bLastWasEndLine = bVar1;
    this->filePtr = (char *)(pbVar2 + 1);
  } while( true );
}

Assistant:

void Parser::ParseLV3MappingChannel(unsigned int iChannel, ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();

    unsigned int iNumTVertices = 0;
    unsigned int iNumTFaces = 0;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Number of texture coordinates in the mesh
            if (TokenMatch(filePtr,"MESH_NUMTVERTEX" ,15))
            {
                ParseLV4MeshLong(iNumTVertices);
                continue;
            }
            // Number of UVWed faces in the mesh
            if (TokenMatch(filePtr,"MESH_NUMTVFACES" ,15))
            {
                ParseLV4MeshLong(iNumTFaces);
                continue;
            }
            // mesh texture vertex list block
            if (TokenMatch(filePtr,"MESH_TVERTLIST" ,14))
            {
                ParseLV3MeshTListBlock(iNumTVertices,mesh,iChannel);
                continue;
            }
            // mesh texture face block
            if (TokenMatch(filePtr,"MESH_TFACELIST" ,14))
            {
                ParseLV3MeshTFaceListBlock(iNumTFaces,mesh, iChannel);
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_MAPPING_CHANNEL");
    }
    return;
}